

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::option_without_value::~option_without_value(option_without_value *this)

{
  option_without_value *this_local;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_without_value_001cc6b8;
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  option_base::~option_base(&this->super_option_base);
  return;
}

Assistant:

~option_without_value(){}